

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

QFontEngine * __thiscall QFontPrivate::engineForScript(QFontPrivate *this,int script)

{
  int iVar1;
  QFontEngineData *pQVar2;
  QFontEngine *pQVar3;
  QRecursiveMutex *pQVar4;
  QFontCache *pQVar5;
  uint script_00;
  QDeadlineTimer QVar6;
  
  pQVar4 = qt_fontdatabase_mutex();
  if (pQVar4 != (QRecursiveMutex *)0x0) {
    QVar6.t2 = 0xffffffff;
    QVar6.type = 0x7fffffff;
    QVar6.t1 = (qint64)pQVar4;
    QRecursiveMutex::tryLock(QVar6);
  }
  script_00 = 2;
  if (3 < script) {
    script_00 = script;
  }
  if (this->engineData != (QFontEngineData *)0x0) {
    iVar1 = this->engineData->fontCacheId;
    pQVar5 = QFontCache::instance();
    if (iVar1 != pQVar5->m_id) {
      pQVar2 = this->engineData;
      LOCK();
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         (pQVar2 = this->engineData, pQVar2 != (QFontEngineData *)0x0)) {
        QFontEngineData::~QFontEngineData(pQVar2);
        operator_delete(pQVar2,0x568);
      }
      this->engineData = (QFontEngineData *)0x0;
    }
  }
  if ((this->engineData == (QFontEngineData *)0x0) ||
     (this->engineData->engines[script_00] == (QFontEngine *)0x0)) {
    QFontDatabasePrivate::load(this,script_00);
  }
  pQVar3 = this->engineData->engines[script_00];
  if (pQVar4 != (QRecursiveMutex *)0x0) {
    QRecursiveMutex::unlock();
  }
  return pQVar3;
}

Assistant:

QFontEngine *QFontPrivate::engineForScript(int script) const
{
    QMutexLocker locker(qt_fontdatabase_mutex());
    if (script <= QChar::Script_Latin)
        script = QChar::Script_Common;
    if (engineData && engineData->fontCacheId != QFontCache::instance()->id()) {
        // throw out engineData that came from a different thread
        if (!engineData->ref.deref())
            delete engineData;
        engineData = nullptr;
    }
    if (!engineData || !QT_FONT_ENGINE_FROM_DATA(engineData, script))
        QFontDatabasePrivate::load(this, script);
    return QT_FONT_ENGINE_FROM_DATA(engineData, script);
}